

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

void delete_data_dictionary(coda_data_dictionary *data_dictionary)

{
  int local_14;
  int i;
  coda_data_dictionary *data_dictionary_local;
  
  if (data_dictionary != (coda_data_dictionary *)0x0) {
    if (data_dictionary->hash_data != (hashtable *)0x0) {
      coda_hashtable_delete(data_dictionary->hash_data);
    }
    if (data_dictionary->product_class != (coda_product_class **)0x0) {
      for (local_14 = 0; local_14 < data_dictionary->num_product_classes; local_14 = local_14 + 1) {
        coda_product_class_delete(data_dictionary->product_class[local_14]);
      }
      free(data_dictionary->product_class);
    }
    for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
      if (data_dictionary->detection_tree[local_14] != (coda_detection_node *)0x0) {
        coda_detection_tree_delete(data_dictionary->detection_tree[local_14]);
      }
    }
    free(data_dictionary);
    return;
  }
  __assert_fail("data_dictionary != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                ,0x377,"void delete_data_dictionary(coda_data_dictionary *)");
}

Assistant:

static void delete_data_dictionary(coda_data_dictionary *data_dictionary)
{
    int i;

    assert(data_dictionary != NULL);
    if (data_dictionary->hash_data != NULL)
    {
        hashtable_delete(data_dictionary->hash_data);
    }
    if (data_dictionary->product_class != NULL)
    {
        for (i = 0; i < data_dictionary->num_product_classes; i++)
        {
            coda_product_class_delete(data_dictionary->product_class[i]);
        }
        free(data_dictionary->product_class);
    }
    for (i = 0; i < CODA_NUM_FORMATS; i++)
    {
        if (data_dictionary->detection_tree[i] != NULL)
        {
            coda_detection_tree_delete(data_dictionary->detection_tree[i]);
        }
    }

    free(data_dictionary);
}